

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void walChecksumBytes(int nativeCksum,u8 *a,int nByte,u32 *aIn,u32 *aOut)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  u32 uVar5;
  u32 uVar6;
  u32 *aData;
  
  if (aIn == (u32 *)0x0) {
    uVar5 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = *aIn;
    uVar5 = aIn[1];
  }
  puVar4 = (uint *)(a + nByte);
  if (nativeCksum == 0) {
    do {
      uVar2 = *(uint *)a;
      uVar3 = *(uint *)((long)a + 4);
      uVar6 = uVar6 + uVar5 +
              (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
      uVar5 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) +
              uVar5 + uVar6;
      a = (u8 *)((long)a + 8);
    } while (a < puVar4);
  }
  else {
    do {
      uVar6 = uVar6 + uVar5 + *(uint *)a;
      puVar1 = (uint *)((long)a + 4);
      a = (u8 *)((long)a + 8);
      uVar5 = uVar5 + *puVar1 + uVar6;
    } while (a < puVar4);
  }
  *aOut = uVar6;
  aOut[1] = uVar5;
  return;
}

Assistant:

static void walChecksumBytes(
  int nativeCksum, /* True for native byte-order, false for non-native */
  u8 *a,           /* Content to be checksummed */
  int nByte,       /* Bytes of content in a[].  Must be a multiple of 8. */
  const u32 *aIn,  /* Initial checksum value input */
  u32 *aOut        /* OUT: Final checksum value output */
){
  u32 s1, s2;
  u32 *aData = (u32 *)a;
  u32 *aEnd = (u32 *)&a[nByte];

  if( aIn ){
    s1 = aIn[0];
    s2 = aIn[1];
  }else{
    s1 = s2 = 0;
  }

  assert( nByte>=8 );
  assert( (nByte&0x00000007)==0 );
  assert( nByte<=65536 );

  if( nativeCksum ){
    do {
      s1 += *aData++ + s2;
      s2 += *aData++ + s1;
    }while( aData<aEnd );
  }else{
    do {
      s1 += BYTESWAP32(aData[0]) + s2;
      s2 += BYTESWAP32(aData[1]) + s1;
      aData += 2;
    }while( aData<aEnd );
  }

  aOut[0] = s1;
  aOut[1] = s2;
}